

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

int __thiscall kj::_::Debug::Fault::init(Fault *this,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX *file;
  int extraout_EAX;
  Exception *this_00;
  Type in_ECX;
  int in_EDX;
  char *in_R8;
  char *in_R9;
  undefined1 in_stack_00000008 [16];
  String local_48;
  char *local_30;
  char *macroArgs_local;
  char *condition_local;
  Type type_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  local_30 = in_R9;
  macroArgs_local = in_R8;
  condition_local._0_4_ = in_ECX;
  condition_local._4_4_ = in_EDX;
  _type_local = ctx;
  file_local = (char *)this;
  this_00 = (Exception *)operator_new(400);
  file = _type_local;
  anon_unknown_2::makeDescriptionImpl
            (&local_48,ASSERTION,macroArgs_local,0,(char *)0x0,local_30,
             (ArrayPtr<kj::String>)in_stack_00000008);
  Exception::Exception(this_00,(Type)condition_local,(char *)file,condition_local._4_4_,&local_48);
  this->exception = this_00;
  String::~String(&local_48);
  return extraout_EAX;
}

Assistant:

void Debug::Fault::init(
    const char* file, int line, Exception::Type type,
    const char* condition, const char* macroArgs, ArrayPtr<String> argValues) {
  exception = new Exception(type, file, line,
      makeDescriptionImpl(ASSERTION, condition, 0, nullptr, macroArgs, argValues));
}